

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_quadratic_model.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse>::energies
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BinaryQuadraticModel<unsigned_int,_double,_cimod::Sparse> *this,
          vector<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
          *samples_like)

{
  pointer puVar1;
  unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  *it;
  pointer sample;
  double local_30;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (samples_like->
           super__Vector_base<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (sample = (samples_like->
                super__Vector_base<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; sample != puVar1; sample = sample + 1) {
    local_30 = energy(this,sample);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FloatType> energies( const std::vector<Sample<IndexType>> &samples_like ) const {
      std::vector<FloatType> en_vec;
      for ( auto &it : samples_like ) {
        en_vec.push_back( energy( it ) );
      }
      return en_vec;
    }